

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

void Ssw_SmlInitializeSpecial(Ssw_Sml_t *p,Vec_Int_t *vInit)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  int local_28;
  int nRegs;
  int i;
  int Entry;
  Aig_Obj_t *pObj;
  Vec_Int_t *vInit_local;
  Ssw_Sml_t *p_local;
  
  iVar1 = Aig_ManRegNum(p->pAig);
  if (iVar1 < 1) {
    __assert_fail("nRegs > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x3a5,"void Ssw_SmlInitializeSpecial(Ssw_Sml_t *, Vec_Int_t *)");
  }
  iVar2 = Aig_ManCiNum(p->pAig);
  if (iVar2 < iVar1) {
    __assert_fail("nRegs <= Aig_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x3a6,"void Ssw_SmlInitializeSpecial(Ssw_Sml_t *, Vec_Int_t *)");
  }
  iVar2 = Vec_IntSize(vInit);
  if (iVar2 != iVar1 * p->nWordsFrame) {
    __assert_fail("Vec_IntSize(vInit) == nRegs * p->nWordsFrame",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x3a7,"void Ssw_SmlInitializeSpecial(Ssw_Sml_t *, Vec_Int_t *)");
  }
  for (local_28 = 0; iVar2 = Saig_ManPiNum(p->pAig), local_28 < iVar2; local_28 = local_28 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,local_28);
    Ssw_SmlAssignRandom(p,pAVar3);
  }
  for (local_28 = 0; iVar2 = Vec_IntSize(vInit), local_28 < iVar2; local_28 = local_28 + 1) {
    iVar2 = Vec_IntEntry(vInit,local_28);
    pAVar3 = Saig_ManLo(p->pAig,local_28 % iVar1);
    Ssw_SmlObjAssignConstWord(p,pAVar3,iVar2,0,local_28 / iVar1);
  }
  return;
}

Assistant:

void Ssw_SmlInitializeSpecial( Ssw_Sml_t * p, Vec_Int_t * vInit )
{
    Aig_Obj_t * pObj;
    int Entry, i, nRegs;
    nRegs = Aig_ManRegNum(p->pAig);
    assert( nRegs > 0 );
    assert( nRegs <= Aig_ManCiNum(p->pAig) );
    assert( Vec_IntSize(vInit) == nRegs * p->nWordsFrame );
    // assign random info for primary inputs
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_SmlAssignRandom( p, pObj );
    // assign the initial state for the latches
    Vec_IntForEachEntry( vInit, Entry, i )
        Ssw_SmlObjAssignConstWord( p, Saig_ManLo(p->pAig, i % nRegs), Entry, 0, i / nRegs );
}